

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_filter.cpp
# Opt level: O2

void __thiscall
ParticleFilter::dataAssociation
          (ParticleFilter *this,
          vector<LandmarkObs,_std::allocator<LandmarkObs>_> *map_landmarks_in_range,
          vector<LandmarkObs,_std::allocator<LandmarkObs>_> *observations_in_map_coordinates)

{
  pointer pLVar1;
  pointer pLVar2;
  ulong uVar3;
  double *pdVar4;
  int map_index;
  ulong unaff_R12;
  int i;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> result;
  value_type local_48;
  
  result.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  result.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  result.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (uVar5 = 0;
      pLVar1 = (observations_in_map_coordinates->
               super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar5 < (ulong)(((long)(observations_in_map_coordinates->
                             super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pLVar1) / 0x18);
      uVar5 = uVar5 + 1) {
    pLVar2 = (map_landmarks_in_range->super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar4 = &pLVar2->y;
    dVar6 = 1e+99;
    for (uVar3 = 0;
        ((long)(map_landmarks_in_range->
               super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>)._M_impl.
               super__Vector_impl_data._M_finish - (long)pLVar2) / 0x18 != uVar3; uVar3 = uVar3 + 1)
    {
      dVar7 = pdVar4[-1] - pLVar1[uVar5].x;
      dVar8 = *pdVar4 - pLVar1[uVar5].y;
      dVar7 = dVar7 * dVar7 + dVar8 * dVar8;
      if (dVar7 < dVar6) {
        unaff_R12 = uVar3;
      }
      unaff_R12 = unaff_R12 & 0xffffffff;
      if (dVar6 <= dVar7) {
        dVar7 = dVar6;
      }
      dVar6 = dVar7;
      pdVar4 = pdVar4 + 3;
    }
    local_48.id = (int)unaff_R12;
    local_48.x = pLVar1[uVar5].x;
    local_48.y = pLVar1[uVar5].y;
    std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::push_back(&result,&local_48);
  }
  std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::operator=
            (observations_in_map_coordinates,&result);
  std::_Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>::~_Vector_base
            (&result.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>);
  return;
}

Assistant:

void ParticleFilter::dataAssociation(std::vector<LandmarkObs> map_landmarks_in_range, std::vector<LandmarkObs>& observations_in_map_coordinates) 
{
  std::vector<LandmarkObs> result;
  for (int i=0; i<observations_in_map_coordinates.size(); i++)
  {
    int map_index;
    double dist_comp = 1.0e99;
    for (int j=0; j<map_landmarks_in_range.size(); j++)
    {
      double delta_x = map_landmarks_in_range[j].x - observations_in_map_coordinates[i].x;
      double delta_y = map_landmarks_in_range[j].y - observations_in_map_coordinates[i].y;
      double d = delta_x * delta_x + delta_y * delta_y; 
      if (d < dist_comp)
      {
        map_index = j;
        dist_comp = d;
      } 
    }
    LandmarkObs l = {map_index, observations_in_map_coordinates[i].x, observations_in_map_coordinates[i].y};
    result.push_back(l);
  }
  observations_in_map_coordinates = result;
}